

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Minefield_Query_PDU.cpp
# Opt level: O0

void __thiscall
KDIS::PDU::Minefield_Query_PDU::Minefield_Query_PDU
          (Minefield_Query_PDU *this,EntityIdentifier *MinefieldID,
          EntityIdentifier *RequestingSimulationID,KUINT8 RequestID,MinefieldDataFilter *DF,
          EntityType *MineTypeFilter)

{
  EntityType *MineTypeFilter_local;
  MinefieldDataFilter *DF_local;
  KUINT8 RequestID_local;
  EntityIdentifier *RequestingSimulationID_local;
  EntityIdentifier *MinefieldID_local;
  Minefield_Query_PDU *this_local;
  
  Minefield_Header::Minefield_Header(&this->super_Minefield_Header);
  (this->super_Minefield_Header).super_Header.super_Header6._vptr_Header6 =
       (_func_int **)&PTR__Minefield_Query_PDU_0032c120;
  DATA_TYPE::EntityIdentifier::EntityIdentifier(&this->m_ReqID,RequestingSimulationID);
  this->m_ui8ReqID = RequestID;
  this->m_ui8NumPerimPoints = '\0';
  this->m_ui8Padding1 = '\0';
  this->m_ui8NumSensTyp = '\0';
  DATA_TYPE::MinefieldDataFilter::MinefieldDataFilter(&this->m_DataFilter,DF);
  DATA_TYPE::EntityType::EntityType(&this->m_MineTypFilter,MineTypeFilter);
  std::
  vector<KDIS::DATA_TYPE::PerimeterPointCoordinate,_std::allocator<KDIS::DATA_TYPE::PerimeterPointCoordinate>_>
  ::vector(&this->m_vPoints);
  std::vector<unsigned_short,_std::allocator<unsigned_short>_>::vector(&this->m_vui16SensorTypes);
  this->m_bNeedsPadding = false;
  this->m_ui16Padding1 = 0;
  (this->super_Minefield_Header).super_Header.super_Header6.m_ui8PDUType = '&';
  (this->super_Minefield_Header).super_Header.super_Header6.m_ui16PDULength = 0x28;
  DATA_TYPE::EntityIdentifier::operator=(&(this->super_Minefield_Header).m_MinefieldID,MinefieldID);
  return;
}

Assistant:

Minefield_Query_PDU::Minefield_Query_PDU( const EntityIdentifier & MinefieldID, const EntityIdentifier & RequestingSimulationID,
        KUINT8 RequestID, const MinefieldDataFilter & DF, const EntityType & MineTypeFilter ) :
    m_ReqID( RequestingSimulationID ),
    m_ui8ReqID( RequestID ),
    m_DataFilter( DF ),
    m_MineTypFilter( MineTypeFilter ),
    m_ui8NumPerimPoints( 0 ),
    m_ui8Padding1( 0 ),
    m_ui8NumSensTyp( 0 ),
    m_bNeedsPadding( 0 ),
    m_ui16Padding1( 0 )
{
    m_ui8PDUType = MinefieldQuery_PDU_Type;
    m_ui16PDULength = MINEFIELD_QUERY_PDU_SIZE;
    m_MinefieldID = MinefieldID;
}